

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::internal::ArgFormatterBase<fmt::ArgFormatter<char>,_char,_fmt::FormatSpec>::visit_char
          (ArgFormatterBase<fmt::ArgFormatter<char>,_char,_fmt::FormatSpec> *this,int value)

{
  byte bVar1;
  uint uVar2;
  Alignment AVar3;
  FormatSpec *pFVar4;
  BasicWriter<char> *pBVar5;
  Buffer<char> *pBVar6;
  size_t sVar7;
  FormatError *this_00;
  char __tmp;
  size_t __len;
  size_t __len_1;
  ulong uVar8;
  ulong __n;
  char *__s;
  size_t __len_2;
  size_t __n_00;
  
  pFVar4 = this->spec_;
  if ((pFVar4->type_ != '\0') && (pFVar4->type_ != 'c')) {
    *(byte *)&pFVar4->flags_ = (byte)pFVar4->flags_ | 0x10;
    BasicWriter<char>::write_int<int,fmt::FormatSpec>(this->writer_,value,*pFVar4);
    return;
  }
  if (((pFVar4->super_AlignSpec).align_ == ALIGN_NUMERIC) || (pFVar4->flags_ != 0)) {
    this_00 = (FormatError *)__cxa_allocate_exception(0x10);
    FormatError::FormatError(this_00,(CStringRef)0x12c93b);
    __cxa_throw(this_00,&FormatError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar8 = (ulong)(pFVar4->super_AlignSpec).super_WidthSpec.width_;
  pBVar5 = this->writer_;
  if (uVar8 < 2) {
    pBVar6 = pBVar5->buffer_;
    sVar7 = pBVar6->size_;
    uVar8 = sVar7 + 1;
    if (pBVar6->capacity_ < uVar8) {
      (**pBVar6->_vptr_Buffer)(pBVar6,uVar8);
    }
    pBVar6->size_ = uVar8;
    __s = pBVar5->buffer_->ptr_ + sVar7;
    goto LAB_0012335d;
  }
  bVar1 = (byte)(pFVar4->super_AlignSpec).super_WidthSpec.fill_;
  pBVar6 = pBVar5->buffer_;
  sVar7 = pBVar6->size_;
  uVar8 = uVar8 + sVar7;
  if (pBVar6->capacity_ < uVar8) {
    (**pBVar6->_vptr_Buffer)(pBVar6,uVar8);
  }
  pBVar6->size_ = uVar8;
  __s = pBVar5->buffer_->ptr_ + sVar7;
  uVar2 = (this->spec_->super_AlignSpec).super_WidthSpec.width_;
  AVar3 = (this->spec_->super_AlignSpec).align_;
  if (AVar3 == ALIGN_CENTER) {
    uVar8 = (ulong)uVar2 - 1;
    __n = uVar8 >> 1;
    if (1 < uVar8) {
      memset(__s,(uint)bVar1,__n);
    }
    __s = __s + __n;
    if (uVar2 == 1) goto LAB_0012335d;
    __n_00 = uVar8 - __n;
  }
  else {
    if (AVar3 == ALIGN_RIGHT) {
      if (uVar2 - 1 != 0) {
        memset(__s,(uint)bVar1,(ulong)(uVar2 - 1));
      }
      __s = __s + ((this->spec_->super_AlignSpec).super_WidthSpec.width_ - 1);
      goto LAB_0012335d;
    }
    if (uVar2 - 1 == 0) goto LAB_0012335d;
    __n_00 = (size_t)(uVar2 - 1);
  }
  memset(__s + 1,(uint)bVar1,__n_00);
LAB_0012335d:
  *__s = (char)value;
  return;
}

Assistant:

void visit_char(int value) {
    if (spec_.type_ && spec_.type_ != 'c') {
      spec_.flags_ |= CHAR_FLAG;
      writer_.write_int(value, spec_);
      return;
    }
    if (spec_.align_ == ALIGN_NUMERIC || spec_.flags_ != 0)
      FMT_THROW(FormatError("invalid format specifier for char"));
    typedef typename BasicWriter<Char>::CharPtr CharPtr;
    Char fill = internal::CharTraits<Char>::cast(spec_.fill());
    CharPtr out = CharPtr();
    const unsigned CHAR_SIZE = 1;
    if (spec_.width_ > CHAR_SIZE) {
      out = writer_.grow_buffer(spec_.width_);
      if (spec_.align_ == ALIGN_RIGHT) {
        std::uninitialized_fill_n(out, spec_.width_ - CHAR_SIZE, fill);
        out += spec_.width_ - CHAR_SIZE;
      } else if (spec_.align_ == ALIGN_CENTER) {
        out = writer_.fill_padding(out, spec_.width_,
                                   internal::const_check(CHAR_SIZE), fill);
      } else {
        std::uninitialized_fill_n(out + CHAR_SIZE,
                                  spec_.width_ - CHAR_SIZE, fill);
      }
    } else {
      out = writer_.grow_buffer(CHAR_SIZE);
    }
    *out = internal::CharTraits<Char>::cast(value);
  }